

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O1

void RDL_addEdge(RDL_graph *gra,uint from,uint to)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  RDL_edge *paRVar4;
  long lVar5;
  
  if (from != to) {
    puVar3 = gra->degree;
    if (puVar3[from] != 0) {
      lVar5 = 0;
      do {
        if (gra->adjList[from][lVar5][0] == to) {
          return;
        }
        lVar5 = lVar5 + 1;
      } while (puVar3[from] != (uint)lVar5);
    }
    gra->E = gra->E + 1;
    uVar2 = puVar3[from];
    uVar1 = uVar2 + 1;
    puVar3[from] = uVar1;
    if (uVar2 == 0) {
      paRVar4 = (RDL_edge *)malloc(8);
    }
    else {
      paRVar4 = (RDL_edge *)realloc(gra->adjList[from],(ulong)uVar1 << 3);
    }
    gra->adjList[from] = paRVar4;
    gra->adjList[from][gra->degree[from] - 1][0] = to;
  }
  return;
}

Assistant:

void RDL_addEdge(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned i;

  /* loops */
  if (from == to) {
    return;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return;
    }
  }
  ++gra->E;
  ++gra->degree[from];
  if(gra->degree[from] == 1)/*was 0, has never been initialized*/
  {
    gra->adjList[from] = malloc(gra->degree[from] * sizeof(*gra->adjList[from]));
  }
  else
  {
    gra->adjList[from] = realloc(gra->adjList[from], gra->degree[from] *
                                 sizeof(*gra->adjList[from]));
  }
  gra->adjList[from][ gra->degree[from]-1 ][0] = to;
}